

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O0

Vec_Int_t * Gia_ManMaxiPerform(Gia_Man_t *p,Vec_Int_t *vInit,int nFrames,int nTimeOut,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Gia_Man_t *p0_00;
  Gia_Man_t *p1_00;
  Gia_Man_t *p_00;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  long lVar5;
  abctime aVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int *piVar9;
  abctime aVar10;
  Vec_Int_t *p_02;
  char *pcVar11;
  bool bVar12;
  abctime local_b0;
  abctime clk;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *pM;
  Gia_Man_t *p1;
  Gia_Man_t *p0;
  Gia_Obj_t *pObj;
  sat_solver *pSat;
  Vec_Int_t *vMap;
  Vec_Int_t *vLits;
  abctime clkSat;
  abctime clkTotal;
  int *pLits;
  int local_38;
  int nLits;
  int status;
  int Iter;
  int iLit;
  int i;
  int nIterMax;
  int fVerbose_local;
  int nTimeOut_local;
  int nFrames_local;
  Vec_Int_t *vInit_local;
  Gia_Man_t *p_local;
  
  iLit = 1000000;
  i = fVerbose;
  nIterMax = nTimeOut;
  fVerbose_local = nFrames;
  _nTimeOut_local = vInit;
  vInit_local = (Vec_Int_t *)p;
  aVar4 = Abc_Clock();
  vLits = (Vec_Int_t *)0x0;
  p0_00 = Gia_ManMaxiUnfold((Gia_Man_t *)vInit_local,fVerbose_local,0,_nTimeOut_local);
  p1_00 = Gia_ManMaxiUnfold((Gia_Man_t *)vInit_local,fVerbose_local,1,_nTimeOut_local);
  p_00 = Gia_ManMiter(p0_00,p1_00,0,0,0,0,0);
  p_01 = Cnf_DeriveGiaRemapped(p_00);
  Gia_ManStop(p0_00);
  Gia_ManStop(p1_00);
  iVar1 = Gia_ManRegNum((Gia_Man_t *)vInit_local);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                  ,0x98,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
  }
  if (i != 0) {
    pcVar11 = "no ";
    if (_nTimeOut_local != (Vec_Int_t *)0x0) {
      pcVar11 = "";
    }
    printf("Running with %d frames and %sgiven init state.\n",(ulong)(uint)fVerbose_local,pcVar11);
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,p_01->nVars);
  if (nIterMax == 0) {
    local_b0 = 0;
  }
  else {
    lVar5 = (long)nIterMax;
    aVar6 = Abc_Clock();
    local_b0 = lVar5 * 1000000 + aVar6;
  }
  sat_solver_set_runtime_limit(s,local_b0);
  for (Iter = 0; Iter < p_01->nClauses; Iter = Iter + 1) {
    iVar1 = sat_solver_addclause(s,p_01->pClauses[Iter],p_01->pClauses[Iter + 1]);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                    ,0xa1,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
    }
  }
  iVar1 = Gia_ManCoNum((Gia_Man_t *)vInit_local);
  pVVar7 = Vec_IntAlloc(iVar1);
  Iter = 0;
  while( true ) {
    iVar1 = Iter;
    iVar2 = Vec_IntSize(p_00->vCos);
    bVar12 = false;
    if (iVar1 < iVar2) {
      p0 = (Gia_Man_t *)Gia_ManCo(p_00,Iter);
      bVar12 = p0 != (Gia_Man_t *)0x0;
    }
    if (!bVar12) break;
    piVar8 = p_01->pVarNums;
    iVar1 = Gia_ObjId(p_00,(Gia_Obj_t *)p0);
    iVar1 = Abc_Var2Lit(piVar8[iVar1],0);
    Vec_IntPush(pVVar7,iVar1);
    Iter = Iter + 1;
  }
  piVar8 = Vec_IntArray(pVVar7);
  piVar9 = Vec_IntArray(pVVar7);
  iVar1 = Vec_IntSize(pVVar7);
  sat_solver_addclause(s,piVar8,piVar9 + iVar1);
  Vec_IntClear(pVVar7);
  Iter = 0;
  while( true ) {
    iVar1 = Iter;
    iVar2 = Gia_ManPiNum(p_00);
    bVar12 = false;
    if (iVar1 < iVar2) {
      p0 = (Gia_Man_t *)Gia_ManCi(p_00,Iter);
      bVar12 = p0 != (Gia_Man_t *)0x0;
    }
    iVar1 = Iter;
    if ((!bVar12) || (iVar2 = Gia_ManRegNum((Gia_Man_t *)vInit_local), iVar1 == iVar2)) break;
    iVar1 = Vec_IntEntry(_nTimeOut_local,Iter);
    if ((iVar1 == 0) || (iVar1 = Vec_IntEntry(_nTimeOut_local,Iter), iVar1 == 1)) {
      piVar8 = p_01->pVarNums;
      iVar1 = Gia_ObjId(p_00,(Gia_Obj_t *)p0);
      iVar1 = Abc_Var2Lit(piVar8[iVar1],1);
      Vec_IntPush(pVVar7,iVar1);
    }
    Iter = Iter + 1;
  }
  if (i != 0) {
    printf("Iter%6d : ",0);
    uVar3 = sat_solver_nvars(s);
    printf("Var =%10d  ",(ulong)uVar3);
    uVar3 = sat_solver_nclauses(s);
    printf("Clause =%10d  ",(ulong)uVar3);
    uVar3 = sat_solver_nconflicts(s);
    printf("Conflict =%10d  ",(ulong)uVar3);
    uVar3 = Vec_IntSize(pVVar7);
    printf("Subset =%6d  ",(ulong)uVar3);
    Abc_PrintTime(1,"Time",0);
  }
  nLits = 0;
  do {
    if (iLit <= nLits) {
LAB_00711c0f:
      p_02 = Vec_IntStart(p_01->nVars);
      for (Iter = 0; iVar1 = Iter, iVar2 = Vec_IntSize(pVVar7), iVar1 < iVar2; Iter = Iter + 1) {
        status = Vec_IntEntry(pVVar7,Iter);
        iVar1 = Abc_Lit2Var(status);
        Vec_IntWriteEntry(p_02,iVar1,1);
      }
      Vec_IntFree(pVVar7);
      pVVar7 = Vec_IntDup(_nTimeOut_local);
      Iter = 0;
      while( true ) {
        iVar1 = Iter;
        iVar2 = Gia_ManPiNum(p_00);
        bVar12 = false;
        if (iVar1 < iVar2) {
          p0 = (Gia_Man_t *)Gia_ManCi(p_00,Iter);
          bVar12 = p0 != (Gia_Man_t *)0x0;
        }
        iVar1 = Iter;
        if ((!bVar12) || (iVar2 = Gia_ManRegNum((Gia_Man_t *)vInit_local), iVar1 == iVar2)) break;
        iVar1 = Vec_IntEntry(pVVar7,Iter);
        if ((iVar1 == 4) || (iVar1 = Vec_IntEntry(pVVar7,Iter), iVar1 == 5)) {
          iVar1 = Iter;
          iVar2 = Vec_IntEntry(pVVar7,Iter);
          Vec_IntWriteEntry(pVVar7,iVar1,iVar2);
        }
        else {
          iVar1 = Vec_IntEntry(pVVar7,Iter);
          if ((iVar1 == 0) || (iVar1 = Vec_IntEntry(pVVar7,Iter), iVar1 == 1)) {
            piVar8 = p_01->pVarNums;
            iVar1 = Gia_ObjId(p_00,(Gia_Obj_t *)p0);
            iVar2 = Vec_IntEntry(p_02,piVar8[iVar1]);
            iVar1 = Iter;
            if (iVar2 == 0) {
              uVar3 = Vec_IntEntry(pVVar7,Iter);
              Vec_IntWriteEntry(pVVar7,iVar1,uVar3 | 2);
            }
          }
        }
        Iter = Iter + 1;
      }
      Vec_IntFree(p_02);
      sat_solver_delete(s);
      Cnf_DataFree(p_01);
      Gia_ManStop(p_00);
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Total runtime",aVar6 - aVar4);
      return pVVar7;
    }
    aVar6 = Abc_Clock();
    piVar8 = Vec_IntArray(pVVar7);
    piVar9 = Vec_IntArray(pVVar7);
    iVar1 = Vec_IntSize(pVVar7);
    local_38 = sat_solver_solve(s,piVar8,piVar9 + iVar1,0,0,0,0);
    aVar10 = Abc_Clock();
    vLits = (Vec_Int_t *)((aVar10 - aVar6) + (long)vLits);
    if (local_38 == 0) {
      printf("Timeout reached after %d seconds and %d iterations.  ",(ulong)(uint)nIterMax,
             (ulong)(uint)nLits);
      goto LAB_00711c0f;
    }
    if (local_38 == 1) {
      printf("The problem is SAT after %d iterations.  ",(ulong)(uint)nLits);
      goto LAB_00711c0f;
    }
    if (local_38 != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                    ,0xce,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
    }
    pLits._4_4_ = sat_solver_final(s,(int **)&clkTotal);
    if (i != 0) {
      printf("Iter%6d : ",(ulong)(nLits + 1));
      uVar3 = sat_solver_nvars(s);
      printf("Var =%10d  ",(ulong)uVar3);
      uVar3 = sat_solver_nclauses(s);
      printf("Clause =%10d  ",(ulong)uVar3);
      uVar3 = sat_solver_nconflicts(s);
      printf("Conflict =%10d  ",(ulong)uVar3);
      printf("Subset =%6d  ",(ulong)pLits._4_4_);
      Abc_PrintTime(1,"Time",(abctime)vLits);
    }
    uVar3 = Vec_IntSize(pVVar7);
    if (uVar3 == pLits._4_4_) {
      uVar3 = Vec_IntSize(pVVar7);
      printf("Reached fixed point with %d entries after %d iterations.  ",(ulong)uVar3,
             (ulong)(nLits + 1));
      goto LAB_00711c0f;
    }
    Vec_IntClear(pVVar7);
    for (Iter = 0; Iter < (int)pLits._4_4_; Iter = Iter + 1) {
      iVar1 = Abc_LitNot(*(int *)(clkTotal + (long)Iter * 4));
      Vec_IntPush(pVVar7,iVar1);
    }
    nLits = nLits + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManMaxiPerform( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nTimeOut, int fVerbose )
{
    int nIterMax = 1000000;
    int i, iLit, Iter, status;
    int nLits, * pLits;
    abctime clkTotal = Abc_Clock();
    abctime clkSat = 0;
    Vec_Int_t * vLits, * vMap;
    sat_solver * pSat;
    Gia_Obj_t * pObj;
    Gia_Man_t * p0 = Gia_ManMaxiUnfold( p, nFrames, 0, vInit );
    Gia_Man_t * p1 = Gia_ManMaxiUnfold( p, nFrames, 1, vInit );
    Gia_Man_t * pM = Gia_ManMiter( p0, p1, 0, 0, 0, 0, 0 );
    Cnf_Dat_t * pCnf = Cnf_DeriveGiaRemapped( pM );
    Gia_ManStop( p0 );
    Gia_ManStop( p1 );
    assert( Gia_ManRegNum(p) > 0 );
    if ( fVerbose )
        printf( "Running with %d frames and %sgiven init state.\n", nFrames, vInit ? "":"no " );

    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );

    // add one large OR clause
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( pM, pObj, i )
        Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], 0) );
    sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );

    // create assumptions
    Vec_IntClear( vLits );
    Gia_ManForEachPi( pM, pObj, i )
        if ( i == Gia_ManRegNum(p) )
            break;
        else if ( Vec_IntEntry(vInit, i) == 0 || Vec_IntEntry(vInit, i) == 1 )
            Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], 1) );

    if ( fVerbose )
    {
        printf( "Iter%6d : ",       0 );
        printf( "Var =%10d  ",      sat_solver_nvars(pSat) );
        printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
        printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
        printf( "Subset =%6d  ",    Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "Time", clkSat );
//      ABC_PRTr( "Solver time", clkSat );
    }
    for ( Iter = 0; Iter < nIterMax; Iter++ )
    {
        abctime clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        clkSat += Abc_Clock() - clk;
        if ( status == l_Undef )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "Timeout reached after %d seconds and %d iterations.  ", nTimeOut, Iter );
            break;
        }
        if ( status == l_True )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "The problem is SAT after %d iterations.  ", Iter );
            break;
        }
        assert( status == l_False );
        nLits = sat_solver_final( pSat, &pLits );
        if ( fVerbose )
        {
            printf( "Iter%6d : ",       Iter+1 );
            printf( "Var =%10d  ",      sat_solver_nvars(pSat) );
            printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
            printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
            printf( "Subset =%6d  ",    nLits );
            Abc_PrintTime( 1, "Time", clkSat );
//            ABC_PRTr( "Solver time", clkSat );
        }
        if ( Vec_IntSize(vLits) == nLits )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "Reached fixed point with %d entries after %d iterations.  ", Vec_IntSize(vLits), Iter+1 );
            break;
        }
        // collect used literals
        Vec_IntClear( vLits );
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vLits, Abc_LitNot(pLits[i]) );
    }
    // create map
    vMap = Vec_IntStart( pCnf->nVars );
    Vec_IntForEachEntry( vLits, iLit, i )
        Vec_IntWriteEntry( vMap, Abc_Lit2Var(iLit), 1 );

    // create output
    Vec_IntFree( vLits );
    vLits = Vec_IntDup(vInit);
    Gia_ManForEachPi( pM, pObj, i )
        if ( i == Gia_ManRegNum(p) )
            break;
        else if ( Vec_IntEntry(vLits, i) == 4 || Vec_IntEntry(vLits, i) == 5 )
            Vec_IntWriteEntry( vLits, i, Vec_IntEntry(vLits, i) );
        else if ( (Vec_IntEntry(vLits, i) == 0 || Vec_IntEntry(vLits, i) == 1) && !Vec_IntEntry(vMap, pCnf->pVarNums[Gia_ObjId(pM, pObj)]) )
            Vec_IntWriteEntry( vLits, i, Vec_IntEntry(vLits, i) | 2 );
    Vec_IntFree( vMap );

    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pM );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return vLits;
}